

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser.cc
# Opt level: O0

bool __thiscall DepfileParser::Parse(DepfileParser *this,string *content,string *err)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  char *str;
  bool bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_d8
  ;
  StringPiece *local_d0;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_c8
  ;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_c0
  ;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_b8
  ;
  StringPiece *local_b0;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_a8
  ;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> local_a0
  ;
  iterator pos;
  StringPiece piece;
  bool is_dependency;
  int len;
  int len_6;
  int len_5;
  int len_4;
  int len_3;
  int n;
  int len_2;
  int len_1;
  uchar yych;
  char *yymarker;
  char *start;
  char *filename;
  char *out;
  bool have_newline;
  bool poisoned_input;
  bool parsing_targets;
  bool have_target;
  char *end;
  char *in;
  string *err_local;
  string *content_local;
  DepfileParser *this_local;
  
  end = (char *)std::__cxx11::string::operator[]((ulong)content);
  lVar10 = std::__cxx11::string::size();
  pcVar11 = end + lVar10;
  bVar5 = false;
  bVar3 = 1;
  bVar4 = false;
  do {
    str = end;
    if (pcVar11 <= end) {
      if (!bVar5) {
        std::__cxx11::string::operator=((string *)err,"expected \':\' in depfile");
      }
      return bVar5;
    }
    bVar14 = false;
    filename = end;
LAB_00147be6:
    pcVar12 = end;
    bVar2 = *end;
    iVar9 = (int)end;
    if ((""[(int)(uint)bVar2] & 0x80) != 0) {
      do {
        pbVar1 = (byte *)(end + 1);
        pcVar13 = end + 1;
        end = end + 1;
      } while ((""[(int)(uint)*pbVar1] & 0x80) != 0);
      goto LAB_00147d21;
    }
    if (0xd < bVar2) {
      if (0x24 < bVar2) {
        if ((0x3f < bVar2) && (bVar2 < 0x5d)) {
          pcVar13 = end + 1;
          bVar2 = end[1];
          pcVar6 = pcVar13;
          if (0x20 < bVar2) break;
          if (bVar2 < 0xb) {
            if (bVar2 != 0) {
              if (9 < bVar2) goto LAB_00147e5a;
              goto LAB_00147e49;
            }
          }
          else {
            if (bVar2 != 0xd) goto joined_r0x00147de6;
            pcVar13 = end + 2;
            if (end[2] == '\n') {
LAB_00147e5a:
              end = pcVar13;
              end = end + 1;
              goto LAB_0014823a;
            }
          }
        }
        goto LAB_00147cad;
      }
      if ((bVar2 < 0x24) || (end[1] != '$')) goto LAB_00147cad;
      *filename = '$';
      filename = filename + 1;
      end = end + 2;
      goto LAB_00147be6;
    }
    if (bVar2 < 10) {
      if (bVar2 == 0) {
        end = end + 1;
        goto LAB_0014823a;
      }
    }
    else if ((bVar2 < 0xb) || ((0xc < bVar2 && (pcVar12 = end + 1, end[1] == '\n')))) {
      end = pcVar12;
      bVar14 = true;
      end = end + 1;
      goto LAB_0014823a;
    }
LAB_00147cad:
    end = end + 1;
LAB_0014823a:
    piece.len_._4_4_ = (int)filename - (int)str;
    bVar8 = (bool)(bVar3 ^ 1);
    if ((0 < piece.len_._4_4_) && (str[piece.len_._4_4_ + -1] == ':')) {
      piece.len_._4_4_ = piece.len_._4_4_ + -1;
      bVar3 = 0;
      bVar5 = true;
    }
    if (0 < piece.len_._4_4_) {
      StringPiece::StringPiece((StringPiece *)&pos,str,(long)piece.len_._4_4_);
      local_a8._M_current =
           (StringPiece *)std::vector<StringPiece,_std::allocator<StringPiece>_>::begin(&this->ins_)
      ;
      local_b0 = (StringPiece *)
                 std::vector<StringPiece,_std::allocator<StringPiece>_>::end(&this->ins_);
      local_a0 = std::
                 find<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,StringPiece>
                           (local_a8,(__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                                      )local_b0,(StringPiece *)&pos);
      local_b8._M_current =
           (StringPiece *)std::vector<StringPiece,_std::allocator<StringPiece>_>::end(&this->ins_);
      bVar7 = __gnu_cxx::operator==(&local_a0,&local_b8);
      if (bVar7) {
        if (bVar8) {
          if (bVar4) {
            std::__cxx11::string::operator=((string *)err,"inputs may not also have inputs");
            return false;
          }
          std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
                    (&this->ins_,(value_type *)&pos);
        }
        else {
          local_c8._M_current =
               (StringPiece *)
               std::vector<StringPiece,_std::allocator<StringPiece>_>::begin(&this->outs_);
          local_d0 = (StringPiece *)
                     std::vector<StringPiece,_std::allocator<StringPiece>_>::end(&this->outs_);
          local_c0 = std::
                     find<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,StringPiece>
                               (local_c8,(__normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_>
                                          )local_d0,(StringPiece *)&pos);
          local_d8._M_current =
               (StringPiece *)
               std::vector<StringPiece,_std::allocator<StringPiece>_>::end(&this->outs_);
          bVar8 = __gnu_cxx::operator==(&local_c0,&local_d8);
          if (bVar8) {
            std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
                      (&this->outs_,(value_type *)&pos);
          }
        }
      }
      else if (!bVar8) {
        bVar4 = true;
      }
    }
    if (bVar14) {
      bVar3 = 1;
      bVar4 = false;
    }
  } while( true );
  do {
    pcVar13 = pcVar6;
    if (bVar2 < 0x3a) {
joined_r0x00147dff:
      if (bVar2 != 0x23) goto LAB_00147e49;
      iVar9 = (int)(pcVar13 + 1) - iVar9;
      if ((2 < iVar9) && (filename < end)) {
        memset(filename,0x5c,(long)(iVar9 + -2));
      }
      pcVar12 = filename + (iVar9 + -2);
      filename = pcVar12 + 1;
      *pcVar12 = '#';
      end = pcVar13 + 1;
      goto LAB_00147be6;
    }
    if (bVar2 < 0x3b) {
LAB_00147f73:
      end = pcVar13;
      bVar2 = end[1];
      if (bVar2 < 0xd) {
        if ((bVar2 == 0) || ((8 < bVar2 && (bVar2 < 0xb)))) {
LAB_001480e0:
          iVar9 = ((int)(end + 2) - iVar9) + -1;
          if (filename < pcVar12) {
            memmove(filename,pcVar12,(long)iVar9);
          }
          filename = filename + iVar9;
          bVar14 = end[1] == '\n';
          end = end + 2;
          goto LAB_0014823a;
        }
      }
      else if ((bVar2 < 0xe) || (bVar2 == 0x20)) goto LAB_001480e0;
      iVar9 = (int)(end + 1) - iVar9;
      if ((2 < iVar9) && (filename < pcVar12)) {
        memset(filename,0x5c,(long)(iVar9 + -2));
      }
      pcVar12 = filename + (iVar9 + -2);
      filename = pcVar12 + 1;
      *pcVar12 = ':';
      end = end + 1;
      goto LAB_00147be6;
    }
    if (bVar2 != 0x5c) goto LAB_00147e49;
    pcVar13 = pcVar6 + 1;
    bVar2 = pcVar6[1];
    if (bVar2 < 0x21) {
      if (bVar2 < 0xb) goto joined_r0x00148068;
      if (bVar2 == 0xd) goto LAB_00147d21;
      if (bVar2 < 0x20) goto LAB_00147e49;
      iVar9 = (int)(pcVar6 + 2) - iVar9;
      if (filename < end) {
        memset(filename,0x5c,(long)(iVar9 + -1));
      }
      filename = filename + (iVar9 + -1);
      end = pcVar6 + 2;
      goto LAB_0014823a;
    }
    if (bVar2 < 0x3a) goto joined_r0x00147dff;
    if (bVar2 < 0x3b) goto LAB_00147f73;
    if (bVar2 != 0x5c) goto LAB_00147e49;
    pcVar13 = pcVar6 + 2;
    bVar2 = pcVar6[2];
    pcVar6 = pcVar13;
  } while (0x20 < bVar2);
  if (bVar2 < 0xb) {
joined_r0x00148068:
    if ((bVar2 == 0) || (9 < bVar2)) goto LAB_00147d21;
  }
  else {
    if (bVar2 == 0xd) goto LAB_00147d21;
joined_r0x00147de6:
    if (0x1f < bVar2) {
      iVar9 = ((int)(pcVar13 + 1) - iVar9) / 2 + -1;
      if (filename < end) {
        memset(filename,0x5c,(long)iVar9);
      }
      pcVar12 = filename + iVar9;
      filename = pcVar12 + 1;
      *pcVar12 = ' ';
      end = pcVar13 + 1;
      goto LAB_00147be6;
    }
  }
LAB_00147e49:
  end = pcVar13;
  pcVar13 = end + 1;
LAB_00147d21:
  end = pcVar13;
  iVar9 = (int)end - iVar9;
  if (filename < pcVar12) {
    memmove(filename,pcVar12,(long)iVar9);
  }
  filename = filename + iVar9;
  goto LAB_00147be6;
}

Assistant:

bool DepfileParser::Parse(string* content, string* err) {
  // in: current parser input point.
  // end: end of input.
  // parsing_targets: whether we are parsing targets or dependencies.
  char* in = &(*content)[0];
  char* end = in + content->size();
  bool have_target = false;
  bool parsing_targets = true;
  bool poisoned_input = false;
  while (in < end) {
    bool have_newline = false;
    // out: current output point (typically same as in, but can fall behind
    // as we de-escape backslashes).
    char* out = in;
    // filename: start of the current parsed filename.
    char* filename = out;
    for (;;) {
      // start: beginning of the current parsed span.
      const char* start = in;
      char* yymarker = NULL;
      
    {
      unsigned char yych;
      static const unsigned char yybm[] = {
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0, 128,   0,   0,   0, 128,   0,   0, 
        128, 128,   0, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128,   0,   0, 128,   0,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128,   0, 128, 
          0, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128, 128,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
      };
      yych = *in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
      if (yych <= '\r') {
        if (yych <= '\t') {
          if (yych >= 0x01) goto yy4;
        } else {
          if (yych <= '\n') goto yy6;
          if (yych <= '\f') goto yy4;
          goto yy8;
        }
      } else {
        if (yych <= '$') {
          if (yych <= '#') goto yy4;
          goto yy12;
        } else {
          if (yych <= '?') goto yy4;
          if (yych <= '\\') goto yy13;
          goto yy4;
        }
      }
      ++in;
      {
        break;
      }
yy4:
      ++in;
yy5:
      {
        // For any other character (e.g. whitespace), swallow it here,
        // allowing the outer logic to loop around again.
        break;
      }
yy6:
      ++in;
      {
        // A newline ends the current file name and the current rule.
        have_newline = true;
        break;
      }
yy8:
      yych = *++in;
      if (yych == '\n') goto yy6;
      goto yy5;
yy9:
      yych = *++in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
yy11:
      {
        // Got a span of plain text.
        int len = (int)(in - start);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        continue;
      }
yy12:
      yych = *++in;
      if (yych == '$') goto yy14;
      goto yy5;
yy13:
      yych = *(yymarker = ++in);
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy5;
          if (yych <= '\t') goto yy16;
          goto yy17;
        } else {
          if (yych == '\r') goto yy19;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
yy14:
      ++in;
      {
        // De-escape dollar character.
        *out++ = '$';
        continue;
      }
yy16:
      ++in;
      goto yy11;
yy17:
      ++in;
      {
        // A line continuation ends the current file name.
        break;
      }
yy19:
      yych = *++in;
      if (yych == '\n') goto yy17;
      in = yymarker;
      goto yy5;
yy21:
      ++in;
      {
        // 2N+1 backslashes plus space -> N backslashes plus space.
        int len = (int)(in - start);
        int n = len / 2 - 1;
        if (out < start)
          memset(out, '\\', n);
        out += n;
        *out++ = ' ';
        continue;
      }
yy23:
      ++in;
      {
        // De-escape hash sign, but preserve other leading backslashes.
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = '#';
        continue;
      }
yy25:
      yych = *++in;
      if (yych <= '\f') {
        if (yych <= 0x00) goto yy28;
        if (yych <= 0x08) goto yy26;
        if (yych <= '\n') goto yy28;
      } else {
        if (yych <= '\r') goto yy28;
        if (yych == ' ') goto yy28;
      }
yy26:
      {
        // De-escape colon sign, but preserve other leading backslashes.
        // Regular expression uses lookahead to make sure that no whitespace
        // nor EOF follows. In that case it'd be the : at the end of a target
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = ':';
        continue;
      }
yy27:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy30;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy32;
          goto yy16;
        }
      }
yy28:
      ++in;
      {
        // Backslash followed by : and whitespace.
        // It is therefore normal text and not an escaped colon
        int len = (int)(in - start - 1);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        if (*(in - 1) == '\n')
          have_newline = true;
        break;
      }
yy30:
      ++in;
      {
        // 2N backslashes plus space -> 2N backslashes, end of filename.
        int len = (int)(in - start);
        if (out < start)
          memset(out, '\\', len - 1);
        out += len - 1;
        break;
      }
yy32:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
    }

    }

    int len = (int)(out - filename);
    const bool is_dependency = !parsing_targets;
    if (len > 0 && filename[len - 1] == ':') {
      len--;  // Strip off trailing colon, if any.
      parsing_targets = false;
      have_target = true;
    }

    if (len > 0) {
      StringPiece piece = StringPiece(filename, len);
      // If we've seen this as an input before, skip it.
      std::vector<StringPiece>::iterator pos = std::find(ins_.begin(), ins_.end(), piece);
      if (pos == ins_.end()) {
        if (is_dependency) {
          if (poisoned_input) {
            *err = "inputs may not also have inputs";
            return false;
          }
          // New input.
          ins_.push_back(piece);
        } else {
          // Check for a new output.
          if (std::find(outs_.begin(), outs_.end(), piece) == outs_.end())
            outs_.push_back(piece);
        }
      } else if (!is_dependency) {
        // We've passed an input on the left side; reject new inputs.
        poisoned_input = true;
      }
    }

    if (have_newline) {
      // A newline ends a rule so the next filename will be a new target.
      parsing_targets = true;
      poisoned_input = false;
    }
  }
  if (!have_target) {
    *err = "expected ':' in depfile";
    return false;
  }
  return true;
}